

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem sweepstep(lua_State *L,global_State *g,int nextstate,GCObject **nextlist)

{
  long lVar1;
  GCObject **ppGVar2;
  
  if (g->sweepgc != (GCObject **)0x0) {
    lVar1 = g->GCdebt;
    ppGVar2 = sweeplist(L,g->sweepgc,0x55);
    g->sweepgc = ppGVar2;
    g->GCestimate = g->GCestimate + (g->GCdebt - lVar1);
    if (ppGVar2 != (GCObject **)0x0) {
      return 0x253;
    }
  }
  g->gcstate = (lu_byte)nextstate;
  g->sweepgc = nextlist;
  return 0;
}

Assistant:

static lu_mem sweepstep (lua_State *L, global_State *g,
                         int nextstate, GCObject **nextlist) {
  if (g->sweepgc) {
    l_mem olddebt = g->GCdebt;
    g->sweepgc = sweeplist(L, g->sweepgc, GCSWEEPMAX);
    g->GCestimate += g->GCdebt - olddebt;  /* update estimate */
    if (g->sweepgc)  /* is there still something to sweep? */
      return (GCSWEEPMAX * GCSWEEPCOST);
  }
  /* else enter next state */
  g->gcstate = nextstate;
  g->sweepgc = nextlist;
  return 0;
}